

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

void __thiscall
helics::InterfaceInfo::disconnectFederate
          (InterfaceInfo *this,GlobalFederateId fedToDisconnect,Time disconnectTime)

{
  shared_mutex *psVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  handle *__range1;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *pub;
  pointer puVar5;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  pointer puVar6;
  pointer puVar7;
  handle phandle;
  unique_lock<std::shared_mutex> local_40;
  
  if (disconnectTime.internalTimeCode != 0x7fffffffffffffff) {
    psVar1 = &(this->inputs).m_mutex;
    std::__shared_mutex_pthread::lock_shared(&psVar1->_M_impl);
    puVar2 = (this->inputs).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->inputs).m_obj.dataStorage.
                  super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      InputInfo::disconnectFederate
                ((puVar6->_M_t).
                 super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                 .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl,fedToDisconnect,
                 disconnectTime);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)psVar1);
  }
  local_40._M_device = &(this->publications).m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar3 = (this->publications).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->publications).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    PublicationInfo::disconnectFederate
              ((puVar5->_M_t).
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,fedToDisconnect
              );
  }
  if (local_40._M_owns == true) {
    std::unique_lock<std::shared_mutex>::unlock(&local_40);
  }
  psVar1 = &(this->endpoints).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&psVar1->_M_impl);
  puVar4 = (this->endpoints).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->endpoints).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
    EndpointInfo::disconnectFederate
              ((puVar7->_M_t).
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,fedToDisconnect);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)psVar1);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void InterfaceInfo::disconnectFederate(GlobalFederateId fedToDisconnect, Time disconnectTime)
{
    if (disconnectTime < cBigTime) {
        auto ihandle = inputs.lock_shared();
        for (auto& ipt : ihandle) {
            ipt->disconnectFederate(fedToDisconnect, disconnectTime);
        }
        ihandle.unlock();
    }

    auto phandle = publications.lock();

    for (auto& pub : phandle) {
        pub->disconnectFederate(fedToDisconnect);
    }
    phandle.unlock();

    auto ehandle = endpoints.lock_shared();

    for (auto& ept : ehandle) {
        ept->disconnectFederate(fedToDisconnect);
    }
    ehandle.unlock();
}